

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_1::PointRenderCase::init
          (PointRenderCase *this,EVP_PKEY_CTX *ctx)

{
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *this_00;
  int iVar1;
  pointer pVVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  NotSupportedError *pNVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  char *pcVar11;
  EVP_PKEY_CTX *ctx_00;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  GLfloat pointSizeRange [2];
  vector<int,_std::allocator<int>_> cellOrder;
  deRandom local_1b0;
  undefined1 local_1a0 [8];
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190 [6];
  ios_base local_128 [264];
  
  if (this->m_isWidePointCase == true) {
    if ((this->super_BBoxRenderCase).m_hasGeometryStage == true) {
      bVar3 = glu::ContextInfo::isExtensionSupported
                        (((this->super_BBoxRenderCase).super_TestCase.m_context)->m_contextInfo,
                         "GL_EXT_geometry_point_size");
      if (!bVar3) {
        pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        local_1a0 = (undefined1  [8])local_190;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a0,"Test requires GL_EXT_geometry_point_size extension","");
        tcu::NotSupportedError::NotSupportedError(pNVar6,(string *)local_1a0);
        __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
    }
    if (((this->super_BBoxRenderCase).m_hasTessellationStage == true) &&
       ((this->super_BBoxRenderCase).m_hasGeometryStage == false)) {
      bVar3 = glu::ContextInfo::isExtensionSupported
                        (((this->super_BBoxRenderCase).super_TestCase.m_context)->m_contextInfo,
                         "GL_EXT_tessellation_point_size");
      if (!bVar3) {
        pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        local_1a0 = (undefined1  [8])local_190;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a0,"Test requires GL_EXT_tessellation_point_size extension","");
        tcu::NotSupportedError::NotSupportedError(pNVar6,(string *)local_1a0);
        __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
    }
    local_1b0.x = 0;
    local_1b0.y = 0;
    iVar4 = (*((this->super_BBoxRenderCase).super_TestCase.m_context)->m_renderCtx->
              _vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar4) + 0x818))(0x846d,&local_1b0);
    if ((float)local_1b0.y < 5.0) {
      pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_1a0 = (undefined1  [8])local_190;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a0,"Test requires point size 5.0","");
      tcu::NotSupportedError::NotSupportedError(pNVar6,(string *)local_1a0);
      __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  local_1a0 = (undefined1  [8])
              ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
              ->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_198,"Rendering point pattern to ",0x1b);
  bVar3 = (this->super_BBoxRenderCase).m_renderTarget == RENDERTARGET_DEFAULT;
  pcVar11 = "fbo";
  if (bVar3) {
    pcVar11 = "default frame buffer";
  }
  lVar9 = 3;
  if (bVar3) {
    lVar9 = 0x14;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,pcVar11,lVar9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_198,
             "Half of the points are green, half blue. Using additive blending.\n",0x42);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_198,
             "Points are in random order, varying pattern size and location for each iteration.\n",
             0x52);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_198,
             "Marking all discardable fragments (fragments outside the bounding box) with a fully saturated red channel."
             ,0x6a);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  std::ios_base::~ios_base(local_128);
  iVar4 = *(int *)&(this->super_BBoxRenderCase).field_0xd4;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_1a0,(long)(iVar4 * iVar4 * 2),
             (allocator_type *)&local_1b0);
  deRandom_init(&local_1b0,0xde22446);
  uVar5 = (uint)((ulong)((long)local_198._M_current - (long)local_1a0) >> 2);
  if (0 < (int)uVar5) {
    uVar7 = 0;
    do {
      *(int *)((long)local_1a0 + uVar7 * 4) = (int)uVar7;
      uVar7 = uVar7 + 1;
    } while ((uVar5 & 0x7fffffff) != uVar7);
  }
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((Random *)&local_1b0,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_1a0,local_198)
  ;
  this_00 = &this->m_attribData;
  ctx_00 = (EVP_PKEY_CTX *)((long)local_198._M_current - (long)local_1a0 >> 1);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (this_00,(size_type)ctx_00);
  if (0 < (int)((ulong)((long)local_198._M_current - (long)local_1a0) >> 2)) {
    iVar4 = 1;
    ctx_00 = (EVP_PKEY_CTX *)0x0;
    lVar9 = 0;
    do {
      uVar5 = *(uint *)((long)local_1a0 + lVar9 * 4);
      iVar1 = *(int *)&(this->super_BBoxRenderCase).field_0xd4;
      lVar10 = CONCAT44((int)uVar5 >> 0x1f,(int)uVar5 >> 1);
      fVar12 = (float)(int)(lVar10 / (long)iVar1);
      iVar8 = (int)(lVar10 % (long)iVar1);
      if ((uVar5 & 1) == 0) {
        fVar13 = fVar12 + 0.5;
        fVar12 = (float)iVar8 + 0.5;
        fVar15 = 0.0;
        fVar14 = 1.0;
      }
      else {
        fVar13 = (float)iVar8;
        fVar14 = 0.0;
        fVar15 = 1.0;
      }
      pVVar2 = (this_00->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar10 = (long)ctx_00 >> 0x1c;
      *(float *)((long)pVVar2->m_data + lVar10) = fVar13 / (float)iVar1;
      *(float *)((long)pVVar2->m_data + lVar10 + 4) = fVar12 / (float)iVar1;
      *(undefined8 *)((long)pVVar2->m_data + lVar10 + 8) = 0x3f80000000000000;
      pVVar2 = (this_00->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pVVar2[iVar4].m_data[0] = 0.0;
      pVVar2[iVar4].m_data[1] = fVar15;
      pVVar2[iVar4].m_data[2] = fVar14;
      pVVar2[iVar4].m_data[3] = 1.0;
      lVar9 = lVar9 + 1;
      ctx_00 = ctx_00 + 0x200000000;
      iVar4 = iVar4 + 2;
    } while (lVar9 < (int)((ulong)((long)local_198._M_current - (long)local_1a0) >> 2));
  }
  if (local_1a0 != (undefined1  [8])0x0) {
    ctx_00 = (EVP_PKEY_CTX *)(local_190[0]._M_allocated_capacity - (long)local_1a0);
    operator_delete((void *)local_1a0,(ulong)ctx_00);
  }
  iVar4 = BBoxRenderCase::init(&this->super_BBoxRenderCase,ctx_00);
  return iVar4;
}

Assistant:

void PointRenderCase::init (void)
{
	if (m_isWidePointCase)
	{
		// extensions
		if (m_hasGeometryStage && !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_point_size"))
			throw tcu::NotSupportedError("Test requires GL_EXT_geometry_point_size extension");
		if (m_hasTessellationStage && !m_hasGeometryStage && !m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_point_size"))
			throw tcu::NotSupportedError("Test requires GL_EXT_tessellation_point_size extension");

		// point size range
		{
			glw::GLfloat pointSizeRange[2] = {0.0f, 0.0f};
			m_context.getRenderContext().getFunctions().getFloatv(GL_ALIASED_POINT_SIZE_RANGE, pointSizeRange);

			if (pointSizeRange[1] < 5.0f)
				throw tcu::NotSupportedError("Test requires point size 5.0");
		}
	}

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Rendering point pattern to " << ((m_renderTarget == RENDERTARGET_DEFAULT) ? ("default frame buffer") : ("fbo")) << ".\n"
		<< "Half of the points are green, half blue. Using additive blending.\n"
		<< "Points are in random order, varying pattern size and location for each iteration.\n"
		<< "Marking all discardable fragments (fragments outside the bounding box) with a fully saturated red channel."
		<< tcu::TestLog::EndMessage;

	generateAttributeData();

	BBoxRenderCase::init();
}